

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

int Dau_DecCheckSetTopOld
              (word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int maskS,word **pCof0,
              word **pCof1,word **pDec)

{
  int iVar1;
  word *local_100;
  word *local_f0;
  word *local_e0;
  word *local_c0;
  word *local_b0;
  word *local_a0;
  uint local_88;
  int uMaskValue;
  int mMax;
  int m;
  int v;
  int pVarsS [16];
  int local_30;
  int i;
  int maskS_local;
  int nVarsS_local;
  int nVarsB_local;
  int nVarsF_local;
  int nVars_local;
  word *p_local;
  
  if ((nVars < 3) || (0x10 < nVars)) {
    __assert_fail("nVars >= 3 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12d,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if (nVars != nVarsF + nVarsB) {
    __assert_fail("nVars == nVarsF + nVarsB",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12e,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((nVarsF < 1) || (nVars + -2 < nVarsF)) {
    __assert_fail("nVarsF >= 1 && nVarsF <= nVars - 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12f,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((nVarsB < 2) || (nVars + -1 < nVarsB)) {
    __assert_fail("nVarsB >= 2 && nVarsB <= nVars - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x130,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((-1 < nVarsS) && (nVarsS <= nVarsB + -2)) {
    if (nVarsS == 0) {
      if (pCof0 == (word **)0x0) {
        local_a0 = (word *)0x0;
      }
      else {
        local_a0 = *pCof0;
      }
      if (pCof1 == (word **)0x0) {
        local_b0 = (word *)0x0;
      }
      else {
        local_b0 = *pCof1;
      }
      if (pDec == (word **)0x0) {
        local_c0 = (word *)0x0;
      }
      else {
        local_c0 = *pDec;
      }
      p_local._4_4_ = Dau_DecCheckSetAny(p,nVars,nVarsF,0,0,local_a0,local_b0,local_c0);
    }
    else {
      if ((maskS < 1) || (1 << ((byte)nVarsB & 0x1f) <= maskS)) {
        __assert_fail("maskS > 0 && maskS < (1 << nVarsB)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                      ,0x135,
                      "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                     );
      }
      local_30 = 0;
      for (mMax = 0; mMax < nVarsB; mMax = mMax + 1) {
        if ((maskS >> ((byte)mMax & 0x1f) & 1U) != 0) {
          (&m)[local_30] = mMax;
          local_30 = local_30 + 1;
        }
      }
      if (local_30 != nVarsS) {
        __assert_fail("i == nVarsS",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                      ,0x139,
                      "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                     );
      }
      for (uMaskValue = 0; uMaskValue < 1 << ((byte)nVarsS & 0x1f); uMaskValue = uMaskValue + 1) {
        local_88 = 0;
        for (mMax = 0; mMax < nVarsS; mMax = mMax + 1) {
          if ((uMaskValue >> ((byte)mMax & 0x1f) & 1U) != 0) {
            local_88 = 1 << ((byte)(&m)[mMax] & 0x1f) | local_88;
          }
        }
        if ((maskS & local_88) != local_88) {
          __assert_fail("(maskS & uMaskValue) == uMaskValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                        ,0x142,
                        "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                       );
        }
        if (pCof0 == (word **)0x0) {
          local_e0 = (word *)0x0;
        }
        else {
          local_e0 = pCof0[uMaskValue];
        }
        if (pCof1 == (word **)0x0) {
          local_f0 = (word *)0x0;
        }
        else {
          local_f0 = pCof1[uMaskValue];
        }
        if (pDec == (word **)0x0) {
          local_100 = (word *)0x0;
        }
        else {
          local_100 = pDec[uMaskValue];
        }
        iVar1 = Dau_DecCheckSetAny(p,nVars,nVarsF,maskS,local_88,local_e0,local_f0,local_100);
        if (iVar1 == 0) {
          return 0;
        }
      }
      p_local._4_4_ = 1;
    }
    return p_local._4_4_;
  }
  __assert_fail("nVarsS >= 0 && nVarsS <= nVarsB - 2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                ,0x131,
                "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
               );
}

Assistant:

int Dau_DecCheckSetTopOld( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int maskS, word ** pCof0, word ** pCof1, word ** pDec )
{
    int i, pVarsS[16];
    int v, m, mMax = (1 << nVarsS), uMaskValue;
    assert( nVars >= 3 && nVars <= 16 );
    assert( nVars == nVarsF + nVarsB );
    assert( nVarsF >= 1 && nVarsF <= nVars - 2 );
    assert( nVarsB >= 2 && nVarsB <= nVars - 1 );
    assert( nVarsS >= 0 && nVarsS <= nVarsB - 2 );
    if ( nVarsS == 0 )
        return Dau_DecCheckSetAny( p, nVars, nVarsF, 0, 0, pCof0? pCof0[0] : 0, pCof1? pCof1[0] : 0, pDec? pDec[0] : 0 );
    // collect shared variables
    assert( maskS > 0 && maskS < (1 << nVarsB) );
    for ( i = 0, v = 0; v < nVarsB; v++ )
        if ( (maskS >> v) & 1 )
            pVarsS[i++] = v;
    assert( i == nVarsS );
    // go through shared set minterms
    for ( m = 0; m < mMax; m++ )
    {
        // generate share set mask
        uMaskValue = 0;
        for ( v = 0; v < nVarsS; v++ )
            if ( (m >> v) & 1 )
                uMaskValue |= (1 << pVarsS[v]);
        assert( (maskS & uMaskValue) == uMaskValue );
        // check decomposition
        if ( !Dau_DecCheckSetAny( p, nVars, nVarsF, maskS, uMaskValue, pCof0? pCof0[m] : 0, pCof1? pCof1[m] : 0, pDec? pDec[m] : 0 ) )
            return 0;
    }
   return 1;
}